

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O2

int stlss_(double *y,int *n,int *np,int *ns,int *isdeg,int *nsjump,int *userw,double *rw,
          double *season,double *work1,double *work2,double *work3,double *work4)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  int local_5c;
  int local_58;
  int c__1;
  int nleft;
  int nright;
  double xs;
  long local_40;
  uint local_38;
  int local_34;
  int k;
  int ok;
  
  local_5c = 1;
  uVar1 = *np;
  if (0 < (int)uVar1) {
    xs = (double)isdeg;
    for (lVar8 = 1; lVar8 != (ulong)uVar1 + 1; lVar8 = lVar8 + 1) {
      iVar2 = *np;
      iVar3 = (*n - (int)lVar8) / iVar2;
      local_38 = iVar3 + 1;
      uVar4 = 0;
      if (0 < (int)local_38) {
        uVar4 = (ulong)local_38;
      }
      pdVar6 = y;
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        work1[uVar7] = *pdVar6;
        pdVar6 = pdVar6 + iVar2;
      }
      local_40 = CONCAT44(local_40._4_4_,local_38);
      if (*userw != 0) {
        pdVar6 = rw;
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          work3[uVar7] = *pdVar6;
          pdVar6 = pdVar6 + iVar2;
        }
      }
      stless_(work1,(int *)&local_38,ns,(int *)xs,nsjump,userw,work3,work2 + 1,work4);
      _nleft = 0.0;
      c__1 = imin(*ns,(int)local_40);
      stlest_(work1,(int *)&local_38,ns,(int *)xs,(double *)&nleft,work2,&local_5c,&c__1,work4,userw
              ,work3,&local_34);
      if (local_34 == 0) {
        *work2 = work2[1];
      }
      _nleft = (double)(iVar3 + 2);
      local_58 = imax(1,(iVar3 + 2) - *ns);
      local_40 = (long)(int)local_40;
      stlest_(work1,(int *)&local_38,ns,(int *)xs,(double *)&nleft,work2 + local_40 + 1,&local_58,
              (int *)&local_38,work4,userw,work3,&local_34);
      if (local_34 == 0) {
        work2[local_40 + 1] = work2[local_40];
      }
      if (iVar3 < -2) {
        iVar3 = -3;
      }
      for (lVar5 = 0; (ulong)(iVar3 + 4) - 1 != lVar5; lVar5 = lVar5 + 1) {
        season[lVar8 + (long)(int)lVar5 * (long)*np + -1] = work2[lVar5];
      }
      y = y + 1;
      rw = rw + 1;
    }
  }
  return 0;
}

Assistant:

int stlss_(double *y, int *n, int *np, int *ns, int *isdeg, int *nsjump, int *userw, double *rw, 
	double *season, double *work1, double *work2, double *work3, double *work4)
{
    /* System generated locals */
    int i__1, i__2, i__3;
	int c__1 = 1;

    /* Local variables */
    int i__, j, k, m;
    int ok;
    double xs;
    int nleft, nright;

/* 	called by stlstp() at the beginning of each (inner) iteration */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --work4;
    --work3;
    --work2;
    --work1;
    --rw;
    --y;
    --season;

    /* Function Body */
    if (*np < 1) {
	return 0;
    }
    i__1 = *np;
    for (j = 1; j <= i__1; ++j) {
	k = (*n - j) / *np + 1;
	i__2 = k;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work1[i__] = y[(i__ - 1) * *np + j];
/* L10: */
	}
	if (*userw) {
	    i__2 = k;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		work3[i__] = rw[(i__ - 1) * *np + j];
/* L12: */
	    }
	}
	stless_(&work1[1], &k, ns, isdeg, nsjump, userw, &work3[1], &work2[2],
		 &work4[1]);
	xs = 0.;
	nright = imin(*ns,k);
	stlest_(&work1[1], &k, ns, isdeg, &xs, &work2[1], &c__1, &nright, &
		work4[1], userw, &work3[1], &ok);
	if (! ok) {
	    work2[1] = work2[2];
	}
	xs = (double) (k + 1);
/* Computing MAX */
	i__2 = 1, i__3 = k - *ns + 1;
	nleft = imax(i__2,i__3);
	stlest_(&work1[1], &k, ns, isdeg, &xs, &work2[k + 2], &nleft, &k, &
		work4[1], userw, &work3[1], &ok);
	if (! ok) {
	    work2[k + 2] = work2[k + 1];
	}
	i__2 = k + 2;
	for (m = 1; m <= i__2; ++m) {
	    season[(m - 1) * *np + j] = work2[m];
/* L18: */
	}
/* L200: */
    }
    return 0;
}